

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O1

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::_add_new_label
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *this,uint label_i)

{
  _Hash_node_base *p_Var1;
  iterator __position;
  pointer puVar2;
  ulong uVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  pointer puVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  mapped_type mVar9;
  long lVar10;
  uint local_24;
  
  uVar3 = (this->_label_to_idx)._M_h._M_bucket_count;
  uVar5 = (ulong)label_i % uVar3;
  p_Var7 = (this->_label_to_idx)._M_h._M_buckets[uVar5];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var7->_M_nxt, p_Var8 = p_Var7, *(uint *)&p_Var7->_M_nxt[1]._M_nxt != label_i)) {
    while (p_Var7 = p_Var1, p_Var1 = p_Var7->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var1[1]._M_nxt % uVar3 != uVar5) ||
         (p_Var8 = p_Var7, *(uint *)&p_Var1[1]._M_nxt == label_i)) goto LAB_0015e9c1;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0015e9c1:
  if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) {
    __position._M_current =
         (this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_idx_to_label,
                 __position,&local_24);
    }
    else {
      *__position._M_current = label_i;
      (this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    puVar6 = (this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar6 != puVar2) {
      uVar3 = (long)puVar2 - (long)puVar6 >> 2;
      lVar10 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar6,puVar2,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar6,puVar2);
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->_label_to_idx)._M_h);
    puVar6 = (this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar6) {
      lVar10 = 0;
      mVar9 = 0;
      do {
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->_label_to_idx,(key_type *)((long)puVar6 + lVar10));
        *pmVar4 = mVar9;
        mVar9 = mVar9 + 1;
        puVar6 = (this->_idx_to_label).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 4;
      } while (mVar9 < (ulong)((long)(this->_idx_to_label).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2)
              );
    }
    _insert_label_into_mat<cimod::Dense>(this,label_i,(dispatch_t<cimod::Dense,_Dense>)0x0);
  }
  return;
}

Assistant:

inline void _add_new_label( IndexType label_i ) {
      if ( _label_to_idx.find( label_i ) == _label_to_idx.end() ) {
        // add label_i
        _idx_to_label.push_back( label_i );
        std::sort( _idx_to_label.begin(), _idx_to_label.end() );
        _set_label_to_idx();

        _insert_label_into_mat( label_i );
      }
    }